

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

json_token * parse_json2(char *s,int s_len)

{
  int iVar1;
  frozen frozen;
  frozen local_28;
  
  local_28.tokens = (json_token *)0x0;
  local_28.max_tokens = 0;
  local_28.num_tokens = 0;
  local_28.end = s + s_len;
  local_28.do_realloc = 1;
  local_28._36_4_ = 0;
  local_28.cur = s;
  iVar1 = doit(&local_28);
  if (iVar1 < 0) {
    free(local_28.tokens);
    local_28.tokens = (json_token *)0x0;
  }
  return local_28.tokens;
}

Assistant:

struct json_token *parse_json2(const char *s, int s_len) {
    struct frozen frozen;

    memset(&frozen, 0, sizeof(frozen));
    frozen.end = s + s_len;
    frozen.cur = s;
    frozen.do_realloc = 1;

    if (doit(&frozen) < 0) {
        FROZEN_FREE((void *) frozen.tokens);
        frozen.tokens = NULL;
    }
    return frozen.tokens;
}